

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

void ClientNetworkLayerClose(UA_Connection *connection)

{
  if (connection->state == UA_CONNECTION_CLOSED) {
    return;
  }
  connection->state = UA_CONNECTION_CLOSED;
  shutdown(connection->sockfd,2);
  close(connection->sockfd);
  return;
}

Assistant:

static void
ClientNetworkLayerClose(UA_Connection *connection) {
#ifdef UA_ENABLE_MULTITHREADING
    if(uatomic_xchg(&connection->state, UA_CONNECTION_CLOSED) == UA_CONNECTION_CLOSED)
        return;
#else
    if(connection->state == UA_CONNECTION_CLOSED)
        return;
    connection->state = UA_CONNECTION_CLOSED;
#endif
    socket_close(connection);
}